

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardFileIterator.h
# Opt level: O2

ssize_t __thiscall
bwtil::BackwardFileIterator::read(BackwardFileIterator *this,int __fd,void *__buf,size_t __nbytes)

{
  symbol sVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined8 unaff_RBP;
  ulint uVar4;
  
  uVar4 = this->ptr_in_buffer;
  sVar1 = this->buffer[uVar4];
  if (uVar4 == 0) {
    if (this->offset == 0) {
      this->begin_of_file = true;
      goto LAB_00118153;
    }
    uVar4 = this->offset - this->bufferSize;
    this->offset = uVar4;
    fseek((FILE *)this->fp,uVar4,0);
    sVar2 = fread(this->buffer,1,this->bufferSize,(FILE *)this->fp);
    if (sVar2 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Error while reading file ");
      poVar3 = std::operator<<(poVar3,(string *)&this->path);
      std::endl<char,std::char_traits<char>>(poVar3);
      exit(0);
    }
    uVar4 = this->bufferSize;
  }
  this->ptr_in_buffer = uVar4 - 1;
LAB_00118153:
  return CONCAT71((int7)((ulong)unaff_RBP >> 8),sVar1) & 0xffffffff;
}

Assistant:

symbol read(){

		symbol s = buffer[ptr_in_buffer];

		if(ptr_in_buffer==0){//read new chunk

			if(offset==0){
				begin_of_file=true;
				return s;
			}

			offset -= bufferSize;

			fseek ( fp , offset , SEEK_SET );

			if(fread(buffer, sizeof(symbol), bufferSize, fp)==0){
				cout << "Error while reading file " << path <<endl;
				exit(0);
			}

			ptr_in_buffer = bufferSize-1;

		}else{
			ptr_in_buffer--;
		}

		return s;

	}